

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall QXmlStreamReaderPrivate::resolveTag(QXmlStreamReaderPrivate *this)

{
  QXmlStreamAttributes *this_00;
  undefined8 *puVar1;
  Attribute *pAVar2;
  qsizetype *pqVar3;
  long lVar4;
  DtdAttribute *pDVar5;
  qsizetype qVar6;
  QString *pQVar7;
  Tag *pTVar8;
  Attribute *pAVar9;
  long lVar10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  long size;
  char16_t *pcVar14;
  NamespaceDeclaration *pNVar15;
  long lVar16;
  pointer pQVar17;
  pointer pQVar18;
  QArrayData *pQVar19;
  QString *pQVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  DtdAttribute *pDVar24;
  long lVar25;
  qsizetype qVar26;
  long lVar27;
  long lVar28;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QStringView rhs_02;
  QStringView rhs_03;
  QStringView rhs_04;
  QStringView rhs_05;
  QStringView rhs_06;
  QStringView prefix;
  QStringView prefix_00;
  QStringView rhs_07;
  QStringView rhs_08;
  QStringView rhs_09;
  QStringView prefix_01;
  QAnyStringView a;
  QLatin1StringView lhs;
  QLatin1StringView lhs_00;
  QLatin1StringView lhs_01;
  QLatin1StringView lhs_02;
  QLatin1StringView lhs_03;
  QLatin1StringView lhs_04;
  QLatin1StringView lhs_05;
  QLatin1StringView lhs_06;
  QStringView lhs_07;
  QStringView lhs_08;
  QStringView lhs_09;
  QXmlStreamAttribute attribute;
  QString *local_130;
  long local_118;
  long local_110;
  QArrayDataPointer<char16_t> local_c8;
  undefined1 local_a8 [112];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->attributeStack).tos;
  size = lVar4 + 1;
  if ((this->field_0x3a9 & 0x10) != 0) {
    pDVar5 = (this->dtdAttributes).data;
    lVar28 = (this->dtdAttributes).tos;
    if (pDVar5 != pDVar5 + lVar28 + 1) {
      pDVar24 = pDVar5;
      do {
        if ((((pDVar24->isNamespaceAttribute == true) &&
             ((pDVar24->defaultValue).m_string != (QString *)0x0)) &&
            (bVar12 = QtPrivate::operator!=(&pDVar24->tagName,&this->qualifiedName), !bVar12)) &&
           ((pDVar24->attributeQualifiedName).m_string != (QString *)0x0)) {
          if (lVar4 < 0) {
            lVar22 = 0;
          }
          else {
            lVar27 = 0;
            lVar22 = 0;
            do {
              puVar1 = (undefined8 *)((long)&(((this->attributeStack).data)->key).pos + lVar27);
              local_a8._8_8_ = *puVar1;
              local_a8._16_8_ = puVar1[1];
              local_a8._0_8_ = &this->textBuffer;
              bVar12 = QtPrivate::operator!=
                                 ((XmlStringRef *)local_a8,&pDVar24->attributeQualifiedName);
              if (!bVar12) break;
              lVar22 = lVar22 + 1;
              lVar27 = lVar27 + 0x30;
            } while (size != lVar22);
          }
          if (lVar22 == size) {
            lVar22 = (pDVar24->attributePrefix).m_size;
            if (lVar22 == 0) {
              pQVar20 = (pDVar24->attributeName).m_string;
              if (pQVar20 == (QString *)0x0) {
                pcVar14 = (char16_t *)0x0;
              }
              else {
                pcVar14 = (pQVar20->d).ptr;
                if (pcVar14 == (char16_t *)0x0) {
                  pcVar14 = L"";
                }
                pcVar14 = pcVar14 + (pDVar24->attributeName).m_pos;
              }
              if (pQVar20 != (QString *)0x0) {
                pQVar20 = (QString *)(pDVar24->attributeName).m_size;
              }
              if ((pQVar20 == (QString *)0x5) &&
                 (rhs.m_data = pcVar14, rhs.m_size = 5, lhs.m_data = "xmlns", lhs.m_size = 5,
                 bVar12 = QtPrivate::equalStrings(lhs,rhs), bVar12)) {
                lVar22 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
                lVar27 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap;
                if (lVar27 <= lVar22 + 1) {
                  lVar22 = lVar22 + 2;
                  lVar16 = lVar27 * 2;
                  if (lVar22 != lVar16 && SBORROW8(lVar22,lVar16) == lVar22 + lVar27 * -2 < 0) {
                    lVar16 = lVar22;
                  }
                  (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap = lVar16;
                  pNVar15 = (NamespaceDeclaration *)
                            realloc((this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.
                                    data,lVar16 * 0x30);
                  (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data = pNVar15;
                  if (pNVar15 == (NamespaceDeclaration *)0x0) {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      qBadAlloc();
                    }
                    goto LAB_0039e2d8;
                  }
                }
                pNVar15 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
                lVar27 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos + 1;
                (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos = lVar27;
                pqVar3 = &pNVar15[lVar27].namespaceUri.m_pos;
                *pqVar3 = 0;
                pqVar3[1] = 0;
                pqVar3 = &pNVar15[lVar27].prefix.m_size;
                *pqVar3 = 0;
                pqVar3[1] = 0;
                pNVar15[lVar27].prefix.m_string = (QString *)0x0;
                pNVar15[lVar27].prefix.m_pos = 0;
                pQVar20 = (pDVar24->defaultValue).m_string;
                lVar22 = (pDVar24->defaultValue).m_pos;
                qVar6 = (pDVar24->defaultValue).m_size;
                if (pQVar20 == (QString *)0x0) {
                  qVar26 = 0;
                  pcVar14 = (char16_t *)0x0;
                }
                else {
                  pcVar14 = (pQVar20->d).ptr;
                  if (pcVar14 == (char16_t *)0x0) {
                    pcVar14 = L"";
                  }
                  pcVar14 = pcVar14 + lVar22;
                  qVar26 = qVar6;
                }
                if ((qVar26 != 0x1d) ||
                   (rhs_04.m_data = pcVar14, rhs_04.m_size = 0x1d,
                   lhs_04.m_data = "http://www.w3.org/2000/xmlns/", lhs_04.m_size = 0x1d,
                   bVar12 = QtPrivate::equalStrings(lhs_04,rhs_04), !bVar12)) {
                  if (pQVar20 == (QString *)0x0) {
                    pcVar14 = (char16_t *)0x0;
                  }
                  else {
                    pcVar14 = (pQVar20->d).ptr;
                    if (pcVar14 == (char16_t *)0x0) {
                      pcVar14 = L"";
                    }
                    pcVar14 = pcVar14 + lVar22;
                  }
                  if ((qVar26 != 0x24) ||
                     (rhs_05.m_data = pcVar14, rhs_05.m_size = 0x24,
                     lhs_05.m_data = "http://www.w3.org/XML/1998/namespace", lhs_05.m_size = 0x24,
                     bVar12 = QtPrivate::equalStrings(lhs_05,rhs_05), !bVar12)) {
                    pNVar15[lVar27].namespaceUri.m_string = pQVar20;
                    pNVar15[lVar27].namespaceUri.m_pos = lVar22;
                    pNVar15[lVar27].namespaceUri.m_size = qVar6;
                    goto LAB_0039d852;
                  }
                }
                QCoreApplication::translate
                          ((QString *)local_a8,"QXmlStream","Illegal namespace declaration.",
                           (char *)0x0,-1);
                this->error = NotWellFormedError;
                QString::operator=(&this->errorString,(QString *)local_a8);
                this->type = Invalid;
                if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
                  }
                }
                goto LAB_0039d852;
              }
            }
            pQVar20 = (pDVar24->attributePrefix).m_string;
            if (pQVar20 == (QString *)0x0) {
              lVar22 = 0;
              pcVar14 = (char16_t *)0x0;
            }
            else {
              pcVar14 = (pQVar20->d).ptr;
              if (pcVar14 == (char16_t *)0x0) {
                pcVar14 = L"";
              }
              pcVar14 = pcVar14 + (pDVar24->attributePrefix).m_pos;
            }
            if ((lVar22 == 5) &&
               (rhs_00.m_data = pcVar14, rhs_00.m_size = 5, lhs_00.m_data = "xmlns",
               lhs_00.m_size = 5, bVar12 = QtPrivate::equalStrings(lhs_00,rhs_00), bVar12)) {
              lVar22 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
              lVar27 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap;
              if (lVar27 <= lVar22 + 1) {
                lVar22 = lVar22 + 2;
                lVar16 = lVar27 * 2;
                if (lVar22 != lVar16 && SBORROW8(lVar22,lVar16) == lVar22 + lVar27 * -2 < 0) {
                  lVar16 = lVar22;
                }
                (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap = lVar16;
                pNVar15 = (NamespaceDeclaration *)
                          realloc((this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data
                                  ,lVar16 * 0x30);
                (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data = pNVar15;
                if (pNVar15 == (NamespaceDeclaration *)0x0) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                    qBadAlloc();
                  }
                  goto LAB_0039e2d8;
                }
              }
              pNVar15 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
              lVar16 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos + 1;
              (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos = lVar16;
              pqVar3 = &pNVar15[lVar16].namespaceUri.m_pos;
              *pqVar3 = 0;
              pqVar3[1] = 0;
              pqVar3 = &pNVar15[lVar16].prefix.m_size;
              *pqVar3 = 0;
              pqVar3[1] = 0;
              pNVar15[lVar16].prefix.m_string = (QString *)0x0;
              pNVar15[lVar16].prefix.m_pos = 0;
              pQVar20 = (pDVar24->attributeName).m_string;
              lVar22 = (pDVar24->attributeName).m_pos;
              lVar27 = (pDVar24->attributeName).m_size;
              if (pQVar20 == (QString *)0x0) {
                lVar21 = 0;
                pcVar14 = (char16_t *)0x0;
              }
              else {
                pcVar14 = (pQVar20->d).ptr;
                if (pcVar14 == (char16_t *)0x0) {
                  pcVar14 = L"";
                }
                pcVar14 = pcVar14 + lVar22;
                lVar21 = lVar27;
              }
              pQVar7 = (pDVar24->defaultValue).m_string;
              lVar10 = (pDVar24->defaultValue).m_pos;
              lVar23 = (pDVar24->defaultValue).m_size;
              if (lVar21 == 3) {
                rhs_01.m_data = pcVar14;
                rhs_01.m_size = 3;
                lhs_01.m_data = "xml";
                lhs_01.m_size = 3;
                bVar12 = QtPrivate::equalStrings(lhs_01,rhs_01);
              }
              else {
                bVar12 = false;
              }
              if (pQVar7 == (QString *)0x0) {
                lVar25 = 0;
                pcVar14 = (char16_t *)0x0;
              }
              else {
                pcVar14 = (pQVar7->d).ptr;
                if (pcVar14 == (char16_t *)0x0) {
                  pcVar14 = L"";
                }
                pcVar14 = pcVar14 + lVar10;
                lVar25 = lVar23;
              }
              if (lVar25 == 0x24) {
                rhs_02.m_data = pcVar14;
                rhs_02.m_size = 0x24;
                lhs_02.m_data = "http://www.w3.org/XML/1998/namespace";
                lhs_02.m_size = 0x24;
                bVar13 = QtPrivate::equalStrings(lhs_02,rhs_02);
              }
              else {
                bVar13 = false;
              }
              if (bVar12 == bVar13) {
                if (pQVar7 == (QString *)0x0) {
                  pcVar14 = (char16_t *)0x0;
                }
                else {
                  pcVar14 = (pQVar7->d).ptr;
                  if (pcVar14 == (char16_t *)0x0) {
                    pcVar14 = L"";
                  }
                  pcVar14 = pcVar14 + lVar10;
                }
                if (lVar25 != 0x1d) {
                  if (lVar23 != 0) goto LAB_0039d69b;
                  goto LAB_0039d5b9;
                }
                rhs_03.m_data = pcVar14;
                rhs_03.m_size = 0x1d;
                lhs_03.m_data = "http://www.w3.org/2000/xmlns/";
                lhs_03.m_size = 0x1d;
                bVar12 = QtPrivate::equalStrings(lhs_03,rhs_03);
                if (lVar23 == 0 || bVar12) goto LAB_0039d5b9;
LAB_0039d69b:
                if (pQVar20 == (QString *)0x0) {
                  pcVar14 = (char16_t *)0x0;
                }
                else {
                  pcVar14 = (pQVar20->d).ptr;
                  if (pcVar14 == (char16_t *)0x0) {
                    pcVar14 = L"";
                  }
                  pcVar14 = pcVar14 + lVar22;
                }
                if ((lVar21 == 5) &&
                   (rhs_06.m_data = pcVar14, rhs_06.m_size = 5, lhs_06.m_data = "xmlns",
                   lhs_06.m_size = 5, bVar12 = QtPrivate::equalStrings(lhs_06,rhs_06), bVar12))
                goto LAB_0039d5b9;
              }
              else {
LAB_0039d5b9:
                QCoreApplication::translate
                          ((QString *)local_a8,"QXmlStream","Illegal namespace declaration.",
                           (char *)0x0,-1);
                this->error = NotWellFormedError;
                QString::operator=(&this->errorString,(QString *)local_a8);
                this->type = Invalid;
                if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
                  }
                }
              }
              pNVar15 = pNVar15 + lVar16;
              (pNVar15->prefix).m_string = pQVar20;
              (pNVar15->prefix).m_pos = lVar22;
              (pNVar15->prefix).m_size = lVar27;
              (pNVar15->namespaceUri).m_string = pQVar7;
              (pNVar15->namespaceUri).m_pos = lVar10;
              (pNVar15->namespaceUri).m_size = lVar23;
            }
          }
        }
LAB_0039d852:
        bVar12 = pDVar24 != pDVar5 + lVar28;
        pDVar24 = pDVar24 + 1;
      } while (bVar12);
    }
  }
  pQVar20 = (this->prefix).m_string;
  if (pQVar20 == (QString *)0x0) {
    pcVar14 = (char16_t *)0x0;
  }
  else {
    pcVar14 = (pQVar20->d).ptr;
    if (pcVar14 == (char16_t *)0x0) {
      pcVar14 = L"";
    }
    pcVar14 = pcVar14 + (this->prefix).m_pos;
  }
  if (pQVar20 != (QString *)0x0) {
    pQVar20 = (QString *)(this->prefix).m_size;
  }
  prefix.m_data = pcVar14;
  prefix.m_size = (qsizetype)pQVar20;
  namespaceForPrefix((XmlStringRef *)local_a8,this,prefix);
  (this->namespaceUri).m_size = local_a8._16_8_;
  (this->namespaceUri).m_string = (QString *)local_a8._0_8_;
  (this->namespaceUri).m_pos = local_a8._8_8_;
  pTVar8 = (this->super_QXmlStreamPrivateTagStack).tagStack.data;
  lVar28 = (this->super_QXmlStreamPrivateTagStack).tagStack.tos;
  pTVar8[lVar28].namespaceDeclaration.namespaceUri.m_size = local_a8._16_8_;
  pNVar15 = &pTVar8[lVar28].namespaceDeclaration;
  (pNVar15->namespaceUri).m_string = (QString *)local_a8._0_8_;
  (pNVar15->namespaceUri).m_pos = local_a8._8_8_;
  this_00 = &this->attributes;
  QList<QXmlStreamAttribute>::resize(&this_00->super_QList<QXmlStreamAttribute>,size);
  if (-1 < lVar4) {
    lVar28 = 0;
    do {
      pQVar17 = QList<QXmlStreamAttribute>::data(&this_00->super_QList<QXmlStreamAttribute>);
      pAVar9 = (this->attributeStack).data;
      pAVar2 = pAVar9 + lVar28;
      lVar22 = (long)pAVar9[lVar28].key.prefix;
      if (lVar22 == 0) {
        local_110 = 0;
        local_118 = 0;
        local_130 = (QString *)0x0;
      }
      else {
        local_118 = (pAVar2->key).pos;
        local_110 = lVar22 + -1;
        local_130 = &this->textBuffer;
      }
      lVar27 = (pAVar2->key).pos;
      lVar16 = (pAVar2->key).len;
      lVar21 = (pAVar2->value).pos;
      lVar23 = (long)(pAVar2->value).prefix;
      lVar10 = (pAVar2->value).len;
      local_a8._0_8_ = (this->textBuffer).d.d;
      local_a8._8_8_ = (this->textBuffer).d.ptr;
      if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_a8._0_8_)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_a8._0_8_)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar17 = pQVar17 + lVar28;
      local_a8._16_8_ = lVar16 - lVar22;
      local_a8._8_8_ = local_a8._8_8_ + (lVar27 + lVar22) * 2;
      QArrayDataPointer<char16_t>::operator=
                ((QArrayDataPointer<char16_t> *)pQVar17,(QArrayDataPointer<char16_t> *)local_a8);
      if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
        }
      }
      local_a8._0_8_ = (this->textBuffer).d.d;
      local_a8._8_8_ = (this->textBuffer).d.ptr;
      if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_a8._0_8_)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_a8._0_8_)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_a8._8_8_ = local_a8._8_8_ + lVar27 * 2;
      local_a8._16_8_ = lVar16;
      QArrayDataPointer<char16_t>::operator=
                (&(pQVar17->m_qualifiedName).m_string,(QArrayDataPointer<char16_t> *)local_a8);
      if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
        }
      }
      local_a8._0_8_ = (this->textBuffer).d.d;
      local_a8._8_8_ = (this->textBuffer).d.ptr;
      if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_a8._0_8_)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_a8._0_8_)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_a8._16_8_ = lVar10 - lVar23;
      local_a8._8_8_ = local_a8._8_8_ + (lVar21 + lVar23) * 2;
      QArrayDataPointer<char16_t>::operator=
                (&(pQVar17->m_value).m_string,(QArrayDataPointer<char16_t> *)local_a8);
      if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
        }
      }
      if (local_110 != 0) {
        local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        if (local_130 == (QString *)0x0) {
          local_110 = 0;
          pcVar14 = (char16_t *)0x0;
        }
        else {
          pcVar14 = (local_130->d).ptr;
          if (pcVar14 == (char16_t *)0x0) {
            pcVar14 = L"";
          }
          pcVar14 = pcVar14 + local_118;
        }
        prefix_00.m_data = pcVar14;
        prefix_00.m_size = local_110;
        namespaceForPrefix((XmlStringRef *)local_a8,this,prefix_00);
        if ((QArrayData *)local_a8._0_8_ == (QArrayData *)0x0) {
          local_c8.d = (Data *)0x0;
          local_c8.ptr = (char16_t *)0x0;
          local_c8.size = 0;
        }
        else {
          local_c8.d = *(Data **)local_a8._0_8_;
          local_c8.ptr = *(char16_t **)(local_a8._0_8_ + 8);
          if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_c8.ptr = local_c8.ptr + local_a8._8_8_;
          local_c8.size = local_a8._16_8_;
        }
        QArrayDataPointer<char16_t>::operator=(&(pQVar17->m_namespaceUri).m_string,&local_c8);
        if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (lVar28 != 0) {
        lVar27 = 0;
        lVar22 = lVar28;
        do {
          pQVar18 = QList<QXmlStreamAttribute>::data(&this_00->super_QList<QXmlStreamAttribute>);
          lVar16 = *(long *)((long)&(pQVar18->m_name).m_string.size + lVar27);
          lVar21 = (pQVar17->m_name).m_string.size;
          if ((lVar16 == lVar21) &&
             (rhs_07.m_data = (pQVar17->m_name).m_string.ptr, rhs_07.m_size = lVar21,
             lhs_07.m_data =
                  *(storage_type_conflict **)((long)&(pQVar18->m_name).m_string.ptr + lVar27),
             lhs_07.m_size = lVar16, bVar12 = QtPrivate::equalStrings(lhs_07,rhs_07), bVar12)) {
            pQVar18 = QList<QXmlStreamAttribute>::data(&this_00->super_QList<QXmlStreamAttribute>);
            lVar16 = *(long *)((long)&(pQVar18->m_namespaceUri).m_string.size + lVar27);
            lVar21 = (pQVar17->m_namespaceUri).m_string.size;
            if ((lVar16 == lVar21) &&
               (rhs_08.m_data = (pQVar17->m_namespaceUri).m_string.ptr, rhs_08.m_size = lVar21,
               lhs_08.m_data =
                    *(storage_type_conflict **)
                     ((long)&(pQVar18->m_namespaceUri).m_string.ptr + lVar27),
               lhs_08.m_size = lVar16, bVar12 = QtPrivate::equalStrings(lhs_08,rhs_08), bVar12)) {
              if ((this->field_0x3a9 & 0x10) == 0) {
                pQVar18 = QList<QXmlStreamAttribute>::data
                                    (&this_00->super_QList<QXmlStreamAttribute>);
                lVar16 = *(long *)((long)&(pQVar18->m_qualifiedName).m_string.size + lVar27);
                lVar21 = (pQVar17->m_qualifiedName).m_string.size;
                if ((lVar16 != lVar21) ||
                   (rhs_09.m_data = (pQVar17->m_qualifiedName).m_string.ptr, rhs_09.m_size = lVar21,
                   lhs_09.m_data =
                        *(storage_type_conflict **)
                         ((long)&(pQVar18->m_qualifiedName).m_string.ptr + lVar27),
                   lhs_09.m_size = lVar16, bVar12 = QtPrivate::equalStrings(lhs_09,rhs_09), !bVar12)
                   ) goto LAB_0039dc9b;
              }
              QCoreApplication::translate
                        ((QString *)&local_c8,"QXmlStream","Attribute \'%1\' redefined.",(char *)0x0
                         ,-1);
              a.m_size = (pQVar17->m_qualifiedName).m_string.size | 0x8000000000000000;
              a.field_0.m_data_utf16 = (pQVar17->m_qualifiedName).m_string.ptr;
              QString::arg_impl((QString *)local_a8,(QString *)&local_c8,a,0,(QChar)0x20);
              this->error = NotWellFormedError;
              QString::operator=(&this->errorString,(QString *)local_a8);
              this->type = Invalid;
              if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
                }
              }
              if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
                }
              }
              goto LAB_0039e1a5;
            }
          }
LAB_0039dc9b:
          lVar27 = lVar27 + 0x68;
          lVar22 = lVar22 + -1;
        } while (lVar22 != 0);
      }
      bVar12 = lVar28 != lVar4;
      lVar28 = lVar28 + 1;
    } while (bVar12);
  }
  pDVar5 = (this->dtdAttributes).data;
  lVar28 = (this->dtdAttributes).tos;
  if (pDVar5 != pDVar5 + lVar28 + 1) {
    pDVar24 = pDVar5;
    do {
      if ((((pDVar24->isNamespaceAttribute == false) &&
           ((pDVar24->defaultValue).m_string != (QString *)0x0)) &&
          (bVar12 = QtPrivate::operator!=(&pDVar24->tagName,&this->qualifiedName), !bVar12)) &&
         ((pDVar24->attributeQualifiedName).m_string != (QString *)0x0)) {
        if (lVar4 < 0) {
          lVar22 = 0;
        }
        else {
          lVar27 = 0;
          lVar22 = 0;
          do {
            puVar1 = (undefined8 *)((long)&(((this->attributeStack).data)->key).pos + lVar27);
            local_a8._8_8_ = *puVar1;
            local_a8._16_8_ = puVar1[1];
            local_a8._0_8_ = &this->textBuffer;
            bVar12 = QtPrivate::operator!=
                               ((XmlStringRef *)local_a8,&pDVar24->attributeQualifiedName);
            if (!bVar12) break;
            lVar22 = lVar22 + 1;
            lVar27 = lVar27 + 0x30;
          } while (size != lVar22);
        }
        if (lVar22 == size) {
          local_a8._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QXmlStreamAttribute::QXmlStreamAttribute((QXmlStreamAttribute *)local_a8);
          uVar11 = local_a8._0_8_;
          pQVar20 = (pDVar24->attributeName).m_string;
          if (pQVar20 == (QString *)0x0) {
            pQVar19 = (QArrayData *)0x0;
            local_a8._8_8_ = (char16_t *)0x0;
            local_a8._16_8_ = (undefined1 *)0x0;
          }
          else {
            pQVar19 = &((pQVar20->d).d)->super_QArrayData;
            local_a8._8_8_ = (pQVar20->d).ptr;
            if (pQVar19 != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&pQVar19->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)&pQVar19->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1
              ;
              UNLOCK();
            }
            local_a8._16_8_ = (pDVar24->attributeName).m_size;
            local_a8._8_8_ = local_a8._8_8_ + (pDVar24->attributeName).m_pos * 2;
          }
          if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              local_a8._0_8_ = pQVar19;
              QArrayData::deallocate((QArrayData *)uVar11,2,0x10);
              pQVar19 = (QArrayData *)local_a8._0_8_;
            }
          }
          local_a8._0_8_ = pQVar19;
          uVar11 = local_a8._48_8_;
          pQVar20 = (pDVar24->attributeQualifiedName).m_string;
          if (pQVar20 == (QString *)0x0) {
            pQVar19 = (QArrayData *)0x0;
            local_a8._56_8_ = (char16_t *)0x0;
            local_a8._64_8_ = 0;
          }
          else {
            pQVar19 = &((pQVar20->d).d)->super_QArrayData;
            local_a8._56_8_ = (pQVar20->d).ptr;
            if (pQVar19 != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&pQVar19->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)&pQVar19->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1
              ;
              UNLOCK();
            }
            local_a8._64_8_ = (pDVar24->attributeQualifiedName).m_size;
            local_a8._56_8_ = local_a8._56_8_ + (pDVar24->attributeQualifiedName).m_pos * 2;
          }
          if ((QArrayData *)local_a8._48_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._48_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._48_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._48_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              local_a8._48_8_ = pQVar19;
              QArrayData::deallocate((QArrayData *)uVar11,2,0x10);
              pQVar19 = (QArrayData *)local_a8._48_8_;
            }
          }
          local_a8._48_8_ = pQVar19;
          uVar11 = local_a8._72_8_;
          pQVar20 = (pDVar24->defaultValue).m_string;
          if (pQVar20 == (QString *)0x0) {
            pQVar19 = (QArrayData *)0x0;
            local_a8._80_8_ = (char16_t *)0x0;
            local_a8._88_8_ = 0;
          }
          else {
            pQVar19 = &((pQVar20->d).d)->super_QArrayData;
            local_a8._80_8_ = (pQVar20->d).ptr;
            if (pQVar19 != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&pQVar19->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)&pQVar19->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1
              ;
              UNLOCK();
            }
            local_a8._88_8_ = (pDVar24->defaultValue).m_size;
            local_a8._80_8_ = local_a8._80_8_ + (pDVar24->defaultValue).m_pos * 2;
          }
          if ((QArrayData *)local_a8._72_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._72_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._72_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._72_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              local_a8._72_8_ = pQVar19;
              QArrayData::deallocate((QArrayData *)uVar11,2,0x10);
              pQVar19 = (QArrayData *)local_a8._72_8_;
            }
          }
          local_a8._72_8_ = pQVar19;
          lVar22 = (pDVar24->attributePrefix).m_size;
          pQVar19 = (QArrayData *)local_a8._24_8_;
          if (lVar22 != 0) {
            local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar20 = (pDVar24->attributePrefix).m_string;
            if (pQVar20 == (QString *)0x0) {
              lVar22 = 0;
              pcVar14 = (char16_t *)0x0;
            }
            else {
              pcVar14 = (pQVar20->d).ptr;
              if (pcVar14 == (char16_t *)0x0) {
                pcVar14 = L"";
              }
              pcVar14 = pcVar14 + (pDVar24->attributePrefix).m_pos;
            }
            prefix_01.m_data = pcVar14;
            prefix_01.m_size = lVar22;
            namespaceForPrefix((XmlStringRef *)&local_c8,this,prefix_01);
            uVar11 = local_a8._24_8_;
            if (&(local_c8.d)->super_QArrayData == (QArrayData *)0x0) {
              pQVar19 = (QArrayData *)0x0;
              local_a8._32_8_ = (char16_t *)0x0;
              local_a8._40_8_ = (undefined1 *)0x0;
            }
            else {
              pQVar19 = *(QArrayData **)local_c8.d;
              lVar22 = *(qsizetype *)((long)local_c8.d + 8);
              if (pQVar19 != (QArrayData *)0x0) {
                LOCK();
                (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i =
                     (pQVar19->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              local_a8._32_8_ = lVar22 + (long)local_c8.ptr * 2;
              local_a8._40_8_ = local_c8.size;
            }
            if ((QArrayData *)local_a8._24_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_a8._24_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_a8._24_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_a8._24_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                local_a8._24_8_ = pQVar19;
                QArrayData::deallocate((QArrayData *)uVar11,2,0x10);
                pQVar19 = (QArrayData *)local_a8._24_8_;
              }
            }
          }
          local_a8._24_8_ = pQVar19;
          local_a8._96_8_ = local_a8._96_8_ | 1;
          QtPrivate::QMovableArrayOps<QXmlStreamAttribute>::emplace<QXmlStreamAttribute>
                    ((QMovableArrayOps<QXmlStreamAttribute> *)this_00,
                     (this->attributes).super_QList<QXmlStreamAttribute>.d.size,
                     (QXmlStreamAttribute *)local_a8);
          QList<QXmlStreamAttribute>::end(&this_00->super_QList<QXmlStreamAttribute>);
          if ((QArrayData *)local_a8._72_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._72_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._72_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._72_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_a8._72_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_a8._48_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._48_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._48_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._48_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_a8._48_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_a8._24_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._24_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._24_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._24_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_a8._24_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
            }
          }
        }
      }
      bVar12 = pDVar24 != pDVar5 + lVar28;
      pDVar24 = pDVar24 + 1;
    } while (bVar12);
  }
LAB_0039e1a5:
  (this->attributeStack).tos = -1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0039e2d8:
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::resolveTag()
{
    const auto attributeStackCleaner = qScopeGuard([this](){ attributeStack.clear(); });
    const qsizetype n = attributeStack.size();

    if (namespaceProcessing) {
        for (DtdAttribute &dtdAttribute : dtdAttributes) {
            if (!dtdAttribute.isNamespaceAttribute
                || dtdAttribute.defaultValue.isNull()
                || dtdAttribute.tagName != qualifiedName
                || dtdAttribute.attributeQualifiedName.isNull())
                continue;
            qsizetype i = 0;
            while (i < n && symName(attributeStack[i].key) != dtdAttribute.attributeQualifiedName)
                ++i;
            if (i != n)
                continue;
            if (dtdAttribute.attributePrefix.isEmpty() && dtdAttribute.attributeName == "xmlns"_L1) {
                NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
                namespaceDeclaration.prefix.clear();

                const XmlStringRef ns(dtdAttribute.defaultValue);
                if (ns == "http://www.w3.org/2000/xmlns/"_L1 ||
                   ns == "http://www.w3.org/XML/1998/namespace"_L1)
                    raiseWellFormedError(QXmlStream::tr("Illegal namespace declaration."));
                else
                    namespaceDeclaration.namespaceUri = ns;
            } else if (dtdAttribute.attributePrefix == "xmlns"_L1) {
                NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
                XmlStringRef namespacePrefix = dtdAttribute.attributeName;
                XmlStringRef namespaceUri = dtdAttribute.defaultValue;
                if (((namespacePrefix == "xml"_L1)
                     ^ (namespaceUri == "http://www.w3.org/XML/1998/namespace"_L1))
                    || namespaceUri == "http://www.w3.org/2000/xmlns/"_L1
                    || namespaceUri.isEmpty()
                    || namespacePrefix == "xmlns"_L1)
                    raiseWellFormedError(QXmlStream::tr("Illegal namespace declaration."));

                namespaceDeclaration.prefix = namespacePrefix;
                namespaceDeclaration.namespaceUri = namespaceUri;
            }
        }
    }

    tagStack.top().namespaceDeclaration.namespaceUri = namespaceUri = namespaceForPrefix(prefix);

    attributes.resize(n);

    for (qsizetype i = 0; i < n; ++i) {
        QXmlStreamAttribute &attribute = attributes[i];
        Attribute &attrib = attributeStack[i];
        XmlStringRef prefix(symPrefix(attrib.key));
        XmlStringRef name(symString(attrib.key));
        XmlStringRef qualifiedName(symName(attrib.key));
        XmlStringRef value(symString(attrib.value));

        attribute.m_name = name;
        attribute.m_qualifiedName = qualifiedName;
        attribute.m_value = value;

        if (!prefix.isEmpty()) {
            XmlStringRef attributeNamespaceUri = namespaceForPrefix(prefix);
            attribute.m_namespaceUri = XmlStringRef(attributeNamespaceUri);
        }

        for (qsizetype j = 0; j < i; ++j) {
            if (attributes[j].name() == attribute.name()
                && attributes[j].namespaceUri() == attribute.namespaceUri()
                && (namespaceProcessing || attributes[j].qualifiedName() == attribute.qualifiedName()))
            {
                raiseWellFormedError(QXmlStream::tr("Attribute '%1' redefined.").arg(attribute.qualifiedName()));
                return;
            }
        }
    }

    for (DtdAttribute &dtdAttribute : dtdAttributes) {
        if (dtdAttribute.isNamespaceAttribute
            || dtdAttribute.defaultValue.isNull()
            || dtdAttribute.tagName != qualifiedName
            || dtdAttribute.attributeQualifiedName.isNull())
            continue;
        qsizetype i = 0;
        while (i < n && symName(attributeStack[i].key) != dtdAttribute.attributeQualifiedName)
            ++i;
        if (i != n)
            continue;



        QXmlStreamAttribute attribute;
        attribute.m_name = dtdAttribute.attributeName;
        attribute.m_qualifiedName = dtdAttribute.attributeQualifiedName;
        attribute.m_value = dtdAttribute.defaultValue;

        if (!dtdAttribute.attributePrefix.isEmpty()) {
            XmlStringRef attributeNamespaceUri = namespaceForPrefix(dtdAttribute.attributePrefix);
            attribute.m_namespaceUri = XmlStringRef(attributeNamespaceUri);
        }
        attribute.m_isDefault = true;
        attributes.append(std::move(attribute));
    }
}